

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>::
AdapterPromiseNode<kj::Canceler&,kj::Promise<unsigned_long>>
          (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>> *this,
          Canceler *params,Promise<unsigned_long> *params_1)

{
  Canceler *canceler;
  Promise<unsigned_long> *pPVar1;
  Promise<unsigned_long> local_38 [3];
  Promise<unsigned_long> *local_20;
  Promise<unsigned_long> *params_local_1;
  Canceler *params_local;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *this_local;
  
  local_20 = params_1;
  params_local_1 = (Promise<unsigned_long> *)params;
  params_local = (Canceler *)this;
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<unsigned_long>::PromiseFulfiller
            ((PromiseFulfiller<unsigned_long> *)(this + 0x18));
  *(undefined ***)this = &PTR_destroy_00c12190;
  *(undefined ***)(this + 0x18) = &PTR_reject_00c121e0;
  ExceptionOr<unsigned_long>::ExceptionOr((ExceptionOr<unsigned_long> *)(this + 0x20));
  this[0x1c8] = (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>)0x1;
  canceler = fwd<kj::Canceler&>((Canceler *)params_local_1);
  pPVar1 = fwd<kj::Promise<unsigned_long>>(local_20);
  Promise<unsigned_long>::Promise(local_38,pPVar1);
  Canceler::AdapterImpl<unsigned_long>::AdapterImpl
            ((AdapterImpl<unsigned_long> *)(this + 0x1d0),
             (PromiseFulfiller<unsigned_long> *)(this + 0x18),canceler,local_38);
  Promise<unsigned_long>::~Promise(local_38);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}